

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void write_tmx_file(char *filename,Image *input_image,vector<Tile_*,_std::allocator<Tile_*>_> *tiles
                   ,vector<Tile_*,_std::allocator<Tile_*>_> *tilemap,TileSize tileSize)

{
  ostream *poVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  string tileset_filename;
  ofstream out;
  uint local_26c;
  char *local_250;
  long local_248;
  char local_240 [16];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::__cxx11::string::string((string *)&local_250,filename,(allocator *)&local_230);
  std::__cxx11::string::append((char *)&local_250);
  write_tiles_to_png_image(local_250,input_image,tiles);
  uVar3 = input_image->width;
  uVar5 = input_image->height;
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)filename);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,
             "<map version=\"1.0\" orientation=\"orthogonal\" renderorder=\"right-down\" width=\"",
             0x4c);
  uVar8 = uVar3 >> 3;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_230,uVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" height=\"",10);
  uVar6 = uVar5 >> 3;
  std::ostream::operator<<(poVar1,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\" tilewidth=\"",0xd);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_230,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" tileheight=\"",0xe);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\">\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230," <tileset firstgid=\"1\" name=\"tileset\" tilewidth=\"",0x31);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_230,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" tileheight=\"",0xe);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\">\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"  <image source=\"",0x11);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,local_250,local_248);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" />\n",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," </tileset>\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230," <layer name=\"Bottom\" width=\"",0x1d);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_230,uVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" height=\"",10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\">\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"  <data encoding=\"csv\" >",0x18);
  uVar7 = (uint)((ulong)((long)(tilemap->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(tilemap->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl
                              .super__Vector_impl_data._M_start) >> 3);
  if (tileSize == TILE_8x8) {
    if (0 < (int)uVar7) {
      uVar3 = 0;
      do {
        get_tmx_tile_id(tilemap,uVar3);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
        if ((int)uVar3 < (int)(uVar7 - 1)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
        }
        if (uVar3 % uVar8 == uVar8 - 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
        }
        uVar3 = uVar3 + 1;
      } while (uVar7 != uVar3);
    }
  }
  else if ((tileSize == TILE_8x16) && (7 < uVar5)) {
    local_26c = 0;
    do {
      if (7 < uVar3) {
        uVar5 = local_26c & 1 | (local_26c >> 1) * uVar8 * 2;
        uVar4 = 0;
        do {
          get_tmx_tile_id(tilemap,uVar5);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
          if ((int)uVar5 < (int)(uVar7 - 1)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,",",1);
          }
          if ((int)(uVar4 % (ulong)uVar8) == uVar8 - 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
          }
          uVar2 = (int)uVar4 + 1;
          uVar4 = (ulong)uVar2;
          uVar5 = uVar5 + 2;
        } while (uVar8 != uVar2);
      }
      local_26c = local_26c + 1;
    } while (local_26c != uVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"  </data>\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," </layer>\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"</map>\n",7);
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  return;
}

Assistant:

void write_tmx_file(const char *filename, Image *input_image, std::vector<Tile *> *tiles, std::vector<Tile *> *tilemap,
                    TileSize tileSize) {
    std::string tileset_filename = filename;

    tileset_filename += ".png";

    write_tiles_to_png_image(tileset_filename.c_str(), input_image, tiles);

    int tilemap_width = input_image->width / TILE_WIDTH;
    int tilemap_height = input_image->height / TILE_HEIGHT;

    std::ofstream out;
    out.open(filename);

    out << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
    out << "<map version=\"1.0\" orientation=\"orthogonal\" renderorder=\"right-down\" width=\"";
    out << tilemap_width << "\" height=\"" << tilemap_height;
    out << "\" tilewidth=\"" << TILE_WIDTH << "\" tileheight=\"" << TILE_HEIGHT << "\">\n";
    out << " <tileset firstgid=\"1\" name=\"tileset\" tilewidth=\"" << TILE_WIDTH << "\" tileheight=\"" << TILE_WIDTH <<
    "\">\n";
    out << "  <image source=\"" << tileset_filename << "\" />\n";
    out << " </tileset>\n";


    out << " <layer name=\"Bottom\" width=\"" << tilemap_width << "\" height=\"" << tilemap_height << "\">\n";
    out << "  <data encoding=\"csv\" >";

    int total_tiles = tilemap->size();

    if (tileSize == TILE_8x8) {
        for (int i = 0; i < total_tiles; i++) {
            unsigned int id = get_tmx_tile_id(tilemap, i);

            out << id;

            if (i < total_tiles - 1) {
                out << ",";
            }

            if (i % tilemap_width == tilemap_width - 1) {
                out << "\n";
            }
        }
    } else if (tileSize == TILE_8x16) {
        for (int y = 0; y < tilemap_height; y++) {
            int i = (y / 2) * tilemap_width * 2 + (y % 2);
            for (int x = 0; x < tilemap_width; x++, i += 2) {
                unsigned int id = get_tmx_tile_id(tilemap, i);

                out << id;

                if (i < total_tiles - 1) {
                    out << ",";
                }

                if (x % tilemap_width == tilemap_width - 1) {
                    out << "\n";
                }
            }
        }
    }

    out << "  </data>\n";
    out << " </layer>\n";
    out << "</map>\n";

    out.close();
}